

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O3

double fas197(double *b,int pq,void *params)

{
  size_t __size;
  size_t __size_00;
  uint N;
  double *__ptr;
  int iVar1;
  uint MRP1;
  undefined4 extraout_var;
  double *P;
  double *VW;
  double *VL;
  double *VK;
  int iVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  double local_60;
  double ssq;
  double fact;
  double *local_48;
  ulong local_40;
  double local_38;
  
  ssq = 0.0;
  local_60 = 0.0;
  lVar5 = (long)*params;
  iVar2 = *(int *)((long)params + 8);
  N = *(uint *)((long)params + 0x18);
  local_38 = (double)lVar5;
  iVar1 = imax(*params,iVar2 + 1);
  fact = (double)CONCAT44(extraout_var,iVar1);
  P = (double *)malloc(lVar5 * 8);
  __size_00 = (long)iVar2 * 8;
  local_40 = (long)iVar2;
  local_48 = (double *)malloc(__size_00);
  lVar4 = (long)fact._0_4_;
  __size = lVar4 * 8 + 8;
  VW = (double *)malloc(__size);
  VL = (double *)malloc(__size);
  VK = (double *)malloc(lVar4 << 3);
  if (0 < (long)local_38) {
    memcpy(P,b,lVar5 * 8);
  }
  iVar2 = (int)local_40;
  if (0 < iVar2) {
    memcpy(local_48,b + lVar5,__size_00);
    iVar2 = (int)local_40;
  }
  __ptr = local_48;
  MRP1 = SUB84(fact,0) + 1;
  local_40 = (ulong)MRP1;
  if (0 < (int)N && *(int *)((long)params + 0x1c) == 1) {
    uVar3 = 0;
    do {
      *(double *)((long)params + uVar3 * 8 + 0x680) =
           *(double *)((long)params + uVar3 * 8 + (ulong)N * 0x10 + 0x680) -
           b[SUB84(local_38,0) + iVar2];
      uVar3 = uVar3 + 1;
    } while (N != uVar3);
  }
  *(undefined8 *)((long)params + 0x30) = 0;
  flikam(P,SUB84(local_38,0),local_48,iVar2,(double *)((long)params + 0x680),
         (double *)((long)params + (long)(int)N * 8 + 0x680),N,&local_60,&ssq,VW,VL,MRP1,VK,
         SUB84(fact,0),0.001);
  local_38 = local_60 * ssq;
  free(P);
  free(__ptr);
  free(VW);
  free(VL);
  free(VK);
  return local_38;
}

Assistant:

double fas197(double *b, int pq, void *params) {
	double value, ssq, fact, delta;
	int ip, iq, i, ifault, N;
	double *phi, *theta,*VW,*VK,*VL;
	int MR, MRP1;

	value = ssq = fact = 0.0;
	alik_object obj = (alik_object)params;

	ip = obj->p;
	iq = obj->q;
	N = obj->N;
	MR = imax(ip, iq + 1);
	MRP1 = MR + 1;
	phi = (double*)malloc(sizeof(double)* ip);
	theta = (double*)malloc(sizeof(double)* iq);
	VW = (double*)malloc(sizeof(double*)*MRP1);
	VL = (double*)malloc(sizeof(double*)*MRP1);
	VK = (double*)malloc(sizeof(double*)*MR);

	for (i = 0; i < ip; ++i) {
		phi[i] = b[i];
	}

	for (i = 0; i < iq; ++i) {
		theta[i] = b[i + ip];
	}

	if (obj->M == 1) {
		for (i = 0; i < N; ++i) {
			obj->x[i] = obj->x[2 * N + i] - b[ip + iq];
		}
	}


	delta = 0.001;
	//mdisplay(P, 1, np);

	obj->ssq = ssq;
	//mdisplay(phi, 1, ip);
	ifault = flikam(phi, ip, theta, iq, obj->x, obj->x+N, N, &ssq, &fact, VW, VL, MRP1, VK, MR, delta);
	value = ssq*fact;

	//printf("sumlog ssq %g %g %d \n", sumlog,value,iter);

	free(phi);
	free(theta);
	free(VW);
	free(VL);
	free(VK);
	//free(bt);
	return value;
}